

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

uint __thiscall Js::ScriptContext::GetNextSourceContextId(ScriptContext *this)

{
  BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  JavascriptLibrary *pJVar4;
  undefined4 *puVar5;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar6;
  int iVar7;
  
  pJVar4 = (this->super_ScriptContextBase).javascriptLibrary;
  pBVar6 = (pJVar4->cache).sourceContextInfoMap.ptr;
  if (pBVar6 == (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    iVar7 = 0;
    if ((pJVar4->cache).dynamicSourceContextInfoMap.ptr !=
        (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) goto LAB_006e8fb4;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x256,
                                "(this->Cache()->sourceContextInfoMap || this->Cache()->dynamicSourceContextInfoMap)"
                                ,
                                "this->Cache()->sourceContextInfoMap || this->Cache()->dynamicSourceContextInfoMap"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pJVar4 = (this->super_ScriptContextBase).javascriptLibrary;
    pBVar6 = (pJVar4->cache).sourceContextInfoMap.ptr;
    if (pBVar6 == (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *)0x0) goto LAB_006e8fb4;
  }
  iVar7 = pBVar6->count - pBVar6->freeCount;
LAB_006e8fb4:
  pBVar1 = (pJVar4->cache).dynamicSourceContextInfoMap.ptr;
  if (pBVar1 != (BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)0x0) {
    iVar7 = (iVar7 + pBVar1->count) - pBVar1->freeCount;
  }
  return iVar7 + 1;
}

Assistant:

uint ScriptContext::GetNextSourceContextId()
    {

        Assert(this->Cache()->sourceContextInfoMap ||
            this->Cache()->dynamicSourceContextInfoMap);

        uint nextSourceContextId = 0;

        if (this->Cache()->sourceContextInfoMap)
        {
            nextSourceContextId = this->Cache()->sourceContextInfoMap->Count();
        }

        if (this->Cache()->dynamicSourceContextInfoMap)
        {
            nextSourceContextId += this->Cache()->dynamicSourceContextInfoMap->Count();
        }

        return nextSourceContextId + 1;
    }